

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pure.cpp
# Opt level: O0

string * fs_with_suffix_abi_cxx11_
                   (string *__return_storage_ptr__,string_view path,string_view new_suffix)

{
  string_view other;
  string_view path_00;
  ulong uVar1;
  path *this;
  char *pcVar2;
  path local_e8;
  path local_c0;
  undefined4 local_98;
  undefined8 local_88;
  size_t sStack_80;
  char *local_78;
  char *pcStack_70;
  char *local_60;
  char *local_58;
  undefined1 local_50 [8];
  string stem;
  string_view new_suffix_local;
  string_view path_local;
  
  new_suffix_local._M_len = (size_t)new_suffix._M_str;
  stem.field_2._8_8_ = new_suffix._M_len;
  pcVar2 = path._M_str;
  local_60 = (char *)path._M_len;
  local_58 = pcVar2;
  new_suffix_local._M_str = local_60;
  fs_stem_abi_cxx11_((string *)local_50,path);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::filesystem::__cxx11::path::
    path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
              (&local_c0,
               (basic_string_view<char,_std::char_traits<char>_> *)&new_suffix_local._M_str,
               auto_format);
    std::filesystem::__cxx11::path::
    path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
              (&local_e8,
               (basic_string_view<char,_std::char_traits<char>_> *)((long)&stem.field_2 + 8),
               auto_format);
    this = (path *)std::filesystem::__cxx11::path::replace_extension(&local_c0);
    std::filesystem::__cxx11::path::generic_string(__return_storage_ptr__,this);
    std::filesystem::__cxx11::path::~path(&local_e8);
    std::filesystem::__cxx11::path::~path(&local_c0);
  }
  else {
    local_78 = new_suffix_local._M_str;
    local_88 = stem.field_2._8_8_;
    sStack_80 = new_suffix_local._M_len;
    path_00._M_str = pcVar2;
    path_00._M_len = (size_t)new_suffix_local._M_str;
    other._M_str = (char *)new_suffix_local._M_len;
    other._M_len = stem.field_2._8_8_;
    pcStack_70 = pcVar2;
    fs_join_abi_cxx11_(__return_storage_ptr__,path_00,other);
  }
  local_98 = 1;
  std::__cxx11::string::~string((string *)local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string fs_with_suffix(std::string_view path, std::string_view new_suffix)
{
  const std::string stem = fs_stem(path);
  // handle directory case: stem is empty
  if(stem.empty())
    return fs_join(path, new_suffix);

#ifdef HAVE_CXX_FILESYSTEM
  return std::filesystem::path(path).replace_extension(new_suffix).generic_string();
#else
  const std::string p = fs_parent(path);

  const std::string r = (p == ".") ? stem : p + "/" + stem;

  return r + std::string(new_suffix);

#endif
}